

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

uint8 * __thiscall
Messages::Person::_InternalSerialize(Person *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  int32 value;
  uint32 uVar2;
  uint uVar3;
  char *pcVar4;
  string *psVar5;
  uint8 *puVar6;
  Person_PhoneNumber *this_00;
  Container<google::protobuf::UnknownFieldSet> *pCVar7;
  uint local_f0;
  uint n;
  uint i;
  uint32 cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8 *target_local;
  Person *this_local;
  UnknownFieldSet *local_a8;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar3 & 1) != 0) {
    _internal_name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    _internal_name_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar1,SERIALIZE,"Messages.Person.name");
    psVar5 = _internal_name_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,psVar5,target);
  }
  if ((uVar3 & 4) != 0) {
    puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    value = _internal_id(this);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    puVar6 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar6);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                             (value,puVar6);
  }
  if ((uVar3 & 2) != 0) {
    _internal_email_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    _internal_email_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar1,SERIALIZE,"Messages.Person.email");
    psVar5 = _internal_email_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,3,psVar5,(uint8 *)stream_local);
  }
  local_f0 = 0;
  uVar3 = _internal_phones_size(this);
  for (; local_f0 < uVar3; local_f0 = local_f0 + 1) {
    puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    this_00 = _internal_phones(this,local_f0);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    puVar6 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar6);
    uVar2 = Person_PhoneNumber::GetCachedSize(this_00);
    puVar6 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar6);
    stream_local = (EpsCopyOutputStream *)
                   Person_PhoneNumber::_InternalSerialize(this_00,puVar6,stream);
  }
  if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
    if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
      pCVar7 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)&this->field_0x8);
      local_a8 = &pCVar7->unknown_fields;
    }
    else {
      local_a8 = (UnknownFieldSet *)google::protobuf::UnknownFieldSet::default_instance();
    }
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (local_a8,(uchar *)stream_local,stream);
  }
  return (uint8 *)stream_local;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Person::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:Messages.Person)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // required string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "Messages.Person.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // required int32 id = 2;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_id(), target);
  }

  // optional string email = 3;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_email().data(), static_cast<int>(this->_internal_email().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "Messages.Person.email");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_email(), target);
  }

  // repeated .Messages.Person.PhoneNumber phones = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_phones_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_phones(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:Messages.Person)
  return target;
}